

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O0

bool __thiscall
MissingDependencyScanner::PathExistsBetween(MissingDependencyScanner *this,Edge *from,Edge *to)

{
  Edge *pEVar1;
  bool bVar2;
  pointer ppVar3;
  Edge *pEVar4;
  reference ppNVar5;
  pointer ppVar6;
  __enable_if_t<is_constructible<value_type,_pair<Edge_*,_unordered_map<Edge_*,_bool>_>_&&>::value,_pair<iterator,_bool>_>
  _Var7;
  pair<Edge_*,_bool> pVar8;
  pair<Edge_*,_bool> local_120;
  Edge *local_110;
  Edge *e;
  size_t i;
  _Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
  _Stack_f8;
  bool found;
  undefined1 local_f0;
  unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>
  local_d8;
  pair<Edge_*,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>
  local_98;
  _Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
  local_58;
  undefined1 local_50;
  _Node_iterator_base<std::pair<Edge_*const,_bool>,_false> local_48;
  _Node_iterator_base<std::pair<Edge_*const,_bool>,_false> local_40;
  iterator inner_it;
  _Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
  local_30;
  iterator it;
  Edge *to_local;
  Edge *from_local;
  MissingDependencyScanner *this_local;
  
  it.
  super__Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
             )(_Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
               )to;
  to_local = from;
  from_local = (Edge *)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<Edge_*,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>_>
       ::find(&this->adjacency_map_,&to_local);
  inner_it.super__Node_iterator_base<std::pair<Edge_*const,_bool>,_false>._M_cur =
       (_Node_iterator_base<std::pair<Edge_*const,_bool>,_false>)
       std::
       unordered_map<Edge_*,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>_>
       ::end(&this->adjacency_map_);
  bVar2 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                      *)&inner_it);
  if (bVar2) {
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false,_false>
                           *)&local_30);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>
         ::find(&ppVar6->second,(key_type *)&it);
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false,_false>
                           *)&local_30);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>
         ::end(&ppVar6->second);
    bVar2 = std::__detail::operator!=(&local_40,&local_48);
    if (bVar2) {
      ppVar3 = std::__detail::_Node_iterator<std::pair<Edge_*const,_bool>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<Edge_*const,_bool>,_false,_false> *)&local_40);
      i._7_1_ = ppVar3->second;
      goto LAB_00142447;
    }
  }
  else {
    local_d8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_d8._M_h._M_rehash_policy._4_4_ = 0;
    local_d8._M_h._M_rehash_policy._M_next_resize = 0;
    local_d8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_d8._M_h._M_element_count = 0;
    local_d8._M_h._M_buckets = (__buckets_ptr)0x0;
    local_d8._M_h._M_bucket_count = 0;
    local_d8._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>
    ::unordered_map(&local_d8);
    std::
    make_pair<Edge*&,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>
              (&local_98,&to_local,&local_d8);
    _Var7 = std::
            unordered_map<Edge*,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>>
            ::
            insert<std::pair<Edge*,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>
                      ((unordered_map<Edge*,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>>
                        *)&this->adjacency_map_,&local_98);
    _Stack_f8._M_cur =
         (__node_type *)
         _Var7.first.
         super__Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
         ._M_cur;
    local_f0 = _Var7.second;
    local_58._M_cur = _Stack_f8._M_cur;
    local_50 = local_f0;
    local_30._M_cur = _Stack_f8._M_cur;
    std::
    pair<Edge_*,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>
    ::~pair(&local_98);
    std::
    unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>
    ::~unordered_map(&local_d8);
  }
  i._7_1_ = 0;
  for (e = (Edge *)0x0; pEVar1 = e,
      pEVar4 = (Edge *)std::vector<Node_*,_std::allocator<Node_*>_>::size
                                 ((vector<Node_*,_std::allocator<Node_*>_> *)
                                  ((long)it.
                                         super__Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                                         ._M_cur + 0x10)), pEVar1 < pEVar4;
      e = (Edge *)((long)&e->rule_ + 1)) {
    ppNVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                        ((vector<Node_*,_std::allocator<Node_*>_> *)
                         ((long)it.
                                super__Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                                ._M_cur + 0x10),(size_type)e);
    local_110 = Node::in_edge(*ppNVar5);
    if ((local_110 != (Edge *)0x0) &&
       ((local_110 == to_local || (bVar2 = PathExistsBetween(this,to_local,local_110), bVar2)))) {
      i._7_1_ = 1;
      break;
    }
  }
  ppVar6 = std::__detail::
           _Node_iterator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false,_false>
                         *)&local_30);
  pVar8 = std::make_pair<Edge*&,bool&>((Edge **)&it,(bool *)((long)&i + 7));
  local_120.first = pVar8.first;
  local_120.second = pVar8.second;
  std::
  unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>
  ::insert<std::pair<Edge*,bool>>
            ((unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>
              *)&ppVar6->second,&local_120);
LAB_00142447:
  this_local._7_1_ = (bool)(i._7_1_ & 1);
  return this_local._7_1_;
}

Assistant:

bool MissingDependencyScanner::PathExistsBetween(Edge* from, Edge* to) {
  AdjacencyMap::iterator it = adjacency_map_.find(from);
  if (it != adjacency_map_.end()) {
    InnerAdjacencyMap::iterator inner_it = it->second.find(to);
    if (inner_it != it->second.end()) {
      return inner_it->second;
    }
  } else {
    it = adjacency_map_.insert(std::make_pair(from, InnerAdjacencyMap())).first;
  }
  bool found = false;
  for (size_t i = 0; i < to->inputs_.size(); ++i) {
    Edge* e = to->inputs_[i]->in_edge();
    if (e && (e == from || PathExistsBetween(from, e))) {
      found = true;
      break;
    }
  }
  it->second.insert(std::make_pair(to, found));
  return found;
}